

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O3

int __thiscall
Gudhi::Persistence_representations::Persistence_landscape::abs(Persistence_landscape *this,int __x)

{
  double dVar1;
  double dVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  undefined4 in_register_00000034;
  long *plVar7;
  long lVar8;
  pair<double,_double> p1;
  pair<double,_double> p2;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  pair<double,_double> local_78;
  value_type local_68;
  long local_48;
  Persistence_landscape *local_40;
  double local_38;
  
  plVar7 = (long *)CONCAT44(in_register_00000034,__x);
  (this->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->number_of_functions_for_vectorization = 0;
  (this->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->number_of_functions_for_projections_to_reals = 0;
  local_40 = this;
  if (plVar7[1] != *plVar7) {
    local_48 = 0;
    do {
      if (AbsDbg == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"level: ",7);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      local_68.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pair<double,_double> *)0x0;
      local_68.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<double,_double> *)0x0;
      local_78.first = -2147483647.0;
      local_78.second = 0.0;
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_68,(iterator)0x0,&local_78);
      lVar3 = local_48;
      lVar5 = *plVar7;
      if (*(long *)(lVar5 + 8 + local_48 * 0x18) - *(long *)(lVar5 + local_48 * 0x18) != 0x10) {
        lVar6 = 1;
        lVar8 = 0;
        do {
          if (AbsDbg == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,"this->land[",0xb);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"][",2);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] : ",4);
            poVar4 = std::ostream::_M_insert<double>
                               (*(double *)(*(long *)(*plVar7 + lVar3 * 0x18) + 0x10 + lVar8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            poVar4 = std::ostream::_M_insert<double>
                               (*(double *)(*(long *)(*plVar7 + lVar3 * 0x18) + 0x18 + lVar8));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            lVar5 = *plVar7;
          }
          lVar5 = *(long *)(lVar5 + lVar3 * 0x18);
          dVar1 = *(double *)(lVar5 + 8 + lVar8);
          dVar2 = *(double *)(lVar5 + 0x18 + lVar8);
          if (0.0 <= dVar1 * dVar2) {
            local_78.second = ABS(dVar2);
            local_78.first = *(double *)(lVar5 + 0x10 + lVar8);
            if (local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_68,
                         (iterator)
                         local_68.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
              local_68.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_68.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if (AbsDbg == '\x01') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,"Adding pair : (",0xf);
              poVar4 = std::ostream::_M_insert<double>
                                 (*(double *)(*(long *)(*plVar7 + lVar3 * 0x18) + 0x10 + lVar8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
              poVar4 = std::ostream::_M_insert<double>
                                 (ABS(*(double *)(*(long *)(*plVar7 + lVar3 * 0x18) + 0x18 + lVar8))
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              std::istream::ignore();
            }
          }
          else {
            p1.second = dVar1;
            p1.first = *(double *)(lVar5 + lVar8);
            p2.second = dVar2;
            p2.first = *(double *)(lVar5 + 0x10 + lVar8);
            local_78.first = find_zero_of_a_line_segment_between_those_two_points(p1,p2);
            local_78.second = 0.0;
            local_38 = local_78.first;
            if (local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_68,
                         (iterator)
                         local_68.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
              local_68.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_68.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar5 = *(long *)(*plVar7 + lVar3 * 0x18);
            local_78.first = *(double *)(lVar5 + 0x10 + lVar8);
            local_78.second = ABS(*(double *)(lVar5 + 0x18 + lVar8));
            if (local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_68.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_68,
                         (iterator)
                         local_68.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_78.first;
              (local_68.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_78.second;
              local_68.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_68.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if (AbsDbg == '\x01') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,"Adding pair : (",0xf);
              poVar4 = std::ostream::_M_insert<double>(local_38);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,",0)",3);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,"In the same step adding pair : (",0x20);
              poVar4 = std::ostream::_M_insert<double>
                                 (*(double *)(*(long *)(*plVar7 + lVar3 * 0x18) + 0x10 + lVar8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
              poVar4 = std::ostream::_M_insert<double>
                                 (ABS(*(double *)(*(long *)(*plVar7 + lVar3 * 0x18) + 0x18 + lVar8))
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              std::istream::ignore();
            }
          }
          lVar5 = *plVar7;
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + 0x10;
        } while (lVar6 != *(long *)(lVar5 + 8 + lVar3 * 0x18) - *(long *)(lVar5 + lVar3 * 0x18) >> 4
                );
      }
      std::
      vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ::push_back(&local_40->land,&local_68);
      if (local_68.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_48 = local_48 + 1;
    } while (local_48 != (plVar7[1] - *plVar7 >> 3) * -0x5555555555555555);
  }
  return (int)local_40;
}

Assistant:

void set_up_numbers_of_functions_for_vectorization_and_projections_to_reals() {
    // warning, this function can be only called after filling in the intervals vector.
    this->number_of_functions_for_vectorization = this->land.size();
    this->number_of_functions_for_projections_to_reals = this->land.size();
  }